

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::commandBindDescriptorsForLayer
          (ImageStoreTestInstance *this,VkCommandBuffer cmdBuffer,VkPipelineLayout pipelineLayout,
          int layerNdx)

{
  VkDescriptorSet destSet;
  DeviceInterface *vk;
  VkDevice device;
  long lVar1;
  DescriptorSetUpdateBuilder *pDVar2;
  VkDescriptorSet descriptorSet;
  VkDescriptorBufferInfo descriptorConstantsBufferInfo;
  Location local_a0;
  Location local_98;
  DescriptorSetUpdateBuilder local_90;
  VkDescriptorImageInfo descriptorImageInfo;
  
  vk = Context::getDeviceInterface
                 ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  device = Context::getDevice((this->super_StoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  lVar1 = (long)layerNdx;
  destSet.m_internal =
       *(deUint64 *)
        &(((this->m_allDescriptorSets).
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar1].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data;
  descriptorImageInfo.imageView.m_internal =
       *(deUint64 *)
        &(((this->m_allImageViews).
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar1].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data;
  descriptorImageInfo.sampler.m_internal = 0;
  descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  descriptorConstantsBufferInfo.range = this->m_constantsBufferChunkSizeBytes;
  descriptorConstantsBufferInfo.buffer.m_internal =
       (((this->m_constantsBuffer).
         super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr)->
       m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descriptorConstantsBufferInfo.offset = lVar1 * descriptorConstantsBufferInfo.range;
  descriptorSet.m_internal = destSet.m_internal;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_90);
  local_98.m_binding = 0;
  local_98.m_arrayElement = 0;
  pDVar2 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (&local_90,destSet,&local_98,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                      &descriptorImageInfo);
  local_a0.m_binding = 1;
  local_a0.m_arrayElement = 0;
  pDVar2 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar2,destSet,&local_a0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                      &descriptorConstantsBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar2,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_90);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,cmdBuffer,1,pipelineLayout.m_internal,0,1,&descriptorSet,0,0);
  return;
}

Assistant:

void ImageStoreTestInstance::commandBindDescriptorsForLayer (const VkCommandBuffer cmdBuffer, const VkPipelineLayout pipelineLayout, const int layerNdx)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const VkDescriptorSet descriptorSet = **m_allDescriptorSets[layerNdx];
	const VkImageView imageView = **m_allImageViews[layerNdx];

	const VkDescriptorImageInfo descriptorImageInfo = makeDescriptorImageInfo(DE_NULL, imageView, VK_IMAGE_LAYOUT_GENERAL);

	// Set the next chunk of the constants buffer. Each chunk begins with layer index that we've set before.
	const VkDescriptorBufferInfo descriptorConstantsBufferInfo = makeDescriptorBufferInfo(
		m_constantsBuffer->get(), layerNdx*m_constantsBufferChunkSizeBytes, m_constantsBufferChunkSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorImageInfo)
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
		.update(vk, device);
	vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
}